

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O3

bool property_from_palette_replace_placeholder_proc
               (Am_Object *ph,Am_Value *new_value,Am_Object *param_3)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Object palette_value_obj;
  Am_Object palette;
  Am_Object AStack_28;
  Am_Object local_20;
  
  pAVar2 = Am_Object::Get(ph,Am_PLACEHOLDER_INITIALIZED,0);
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    pAVar2 = Am_Object::Get(ph,0x169,0);
    Am_Value::operator=(new_value,pAVar2);
  }
  else {
    Am_Object::Set(ph,Am_PLACEHOLDER_INITIALIZED,true,0);
    pAVar2 = Am_Object::Get(ph,Am_REGISTRY_FOR_PALETTES,0);
    Am_Object::Am_Object(&local_20,pAVar2);
    pAVar2 = Am_Object::Get(&local_20,0x169,0);
    Am_Value::operator=(new_value,pAVar2);
    if (new_value->type == 0xa001) {
      Am_Object::Am_Object(&AStack_28,new_value);
      pAVar2 = Am_Object::Get(&AStack_28,0x6a,1);
      Am_Value::operator=(new_value,pAVar2);
      Am_Object::~Am_Object(&AStack_28);
    }
    if (am_sdebug == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Got value ",10);
      poVar3 = operator<<((ostream *)&std::cout,new_value);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," from palette ",0xe);
      poVar3 = operator<<(poVar3,&local_20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," for ",5);
      poVar3 = operator<<(poVar3,ph);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::ostream::flush();
    }
    Am_Object::~Am_Object(&local_20);
  }
  return true;
}

Assistant:

Am_Define_Method(Am_Placeholder_Replace_Method, bool,
                 property_from_palette_replace_placeholder,
                 (Am_Object & ph, Am_Value &new_value,
                  Am_Object & /* sel_widget */))
{
  if (ph.Get(Am_PLACEHOLDER_INITIALIZED).Valid()) {
    new_value = ph.Get(Am_VALUE);
    return true;
  } else {
    ph.Set(Am_PLACEHOLDER_INITIALIZED, true);
    Am_Object palette = ph.Get(Am_REGISTRY_FOR_PALETTES);
    new_value = palette.Get(Am_VALUE);
    if (new_value.type == Am_OBJECT) {
      Am_Object palette_value_obj = new_value;
      new_value = palette_value_obj.Peek(Am_FILL_STYLE);
    }
    if (am_sdebug)
      std::cout << "Got value " << new_value << " from palette " << palette
                << " for " << ph << std::endl
                << std::flush;
    return true;
  }
}